

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O1

void __thiscall r_exec::HLPController::~HLPController(HLPController *this)

{
  _Object *p_Var1;
  
  (this->super_OController).super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__HLPController_001c0078;
  std::vector<core::P<r_exec::HLPController>,_std::allocator<core::P<r_exec::HLPController>_>_>::
  ~vector(&this->controllers);
  p_Var1 = (this->bindings).object;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((p_Var1->refCount).super___atomic_base<long>._M_i < 1) {
      (*p_Var1->_vptr__Object[1])();
    }
  }
  std::
  vector<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
  ::~vector(&(this->predicted_evidences).evidences.cells);
  std::
  vector<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
  ::~vector(&(this->evidences).evidences.cells);
  OController::~OController(&this->super_OController);
  return;
}

Assistant:

HLPController::~HLPController()
{
}